

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O0

size_t __thiscall
booster::aio::buffer_impl<const_char_*>::bytes_count(buffer_impl<const_char_*> *this)

{
  size_type sVar1;
  const_reference pvVar2;
  int *in_RDI;
  size_t i;
  size_t n;
  ulong local_20;
  size_t local_18;
  size_t local_8;
  
  if (*in_RDI == 0) {
    local_8 = 0;
  }
  else if (*in_RDI == 1) {
    local_8 = *(size_t *)(in_RDI + 4);
  }
  else {
    local_18 = 0;
    local_20 = 0;
    while( true ) {
      sVar1 = std::
              vector<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
              ::size((vector<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                      *)(in_RDI + 6));
      if (sVar1 <= local_20) break;
      pvVar2 = std::
               vector<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
               ::operator[]((vector<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                             *)(in_RDI + 6),local_20);
      local_18 = pvVar2->size + local_18;
      local_20 = local_20 + 1;
    }
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

size_t bytes_count() const
			{
				if(size_ == 0)
					return 0;
				if(size_ == 1)
					return entry_.size;
				size_t n = 0;
				for(size_t i=0;i<vec_.size();i++)
					n+=vec_[i].size;
				return n;
			}